

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xxhash.h
# Opt level: O0

xxh_u32 XXH32_avalanche(xxh_u32 h32)

{
  uint uVar1;
  xxh_u32 h32_local;
  
  uVar1 = (h32 >> 0xf ^ h32) * -0x7a143589;
  uVar1 = (uVar1 >> 0xd ^ uVar1) * -0x3d4d51c3;
  return uVar1 >> 0x10 ^ uVar1;
}

Assistant:

static xxh_u32 XXH32_avalanche(xxh_u32 h32) {
  h32 ^= h32 >> 15;
  h32 *= XXH_PRIME32_2;
  h32 ^= h32 >> 13;
  h32 *= XXH_PRIME32_3;
  h32 ^= h32 >> 16;
  return (h32);
}